

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  unsigned_long uVar25;
  long lVar26;
  uint *puVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  vuint<4> vgeomID;
  vuint<4> vprimID;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong local_f8;
  PrimRef *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_88;
  BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_> *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48 [6];
  
  uVar25 = set->_begin;
  uVar18 = (set->_end - uVar25) + 3;
  local_f8 = uVar18 >> 2;
  local_108 = local_f8 * 0xb0;
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  local_f0 = prims;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_78);
    }
    else {
      *__position._M_current = this_01;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar28 = local_108;
  pTVar4->bytesUsed = pTVar4->bytesUsed + local_108;
  sVar22 = pTVar4->cur;
  uVar23 = (ulong)(-(int)sVar22 & 0xf);
  uVar19 = sVar22 + local_108 + uVar23;
  pTVar4->cur = uVar19;
  if (pTVar4->end < uVar19) {
    pTVar4->cur = sVar22;
    uVar19 = pTVar4->allocBlockSize;
    if (local_108 * 4 < uVar19 || local_108 * 4 - uVar19 == 0) {
      local_e8 = (undefined8 *)uVar19;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar4->ptr = pcVar20;
      sVar22 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar22;
      pTVar4->end = (size_t)local_e8;
      pTVar4->cur = uVar28;
      if (local_e8 < uVar28) {
        pTVar4->cur = 0;
        local_e8 = (undefined8 *)pTVar4->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar4->ptr = pcVar20;
        sVar22 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar22;
        pTVar4->end = (size_t)local_e8;
        pTVar4->cur = uVar28;
        if (local_e8 < uVar28) {
          pTVar4->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_00c1edee;
        }
      }
      pTVar4->bytesWasted = sVar22;
    }
    else {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_108);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar23;
    pcVar20 = pTVar4->ptr + (uVar19 - local_108);
  }
LAB_00c1edee:
  if (3 < uVar18) {
    lVar26 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar24 = 0;
    local_88 = lVar26;
    local_80 = this;
    do {
      uVar18 = set->_end;
      uVar33 = 0xffffffff;
      uVar30 = 0xffffffff;
      uVar31 = 0xffffffff;
      uVar32 = 0xffffffff;
      local_108._0_4_ = 0xffffffff;
      local_108._4_4_ = 0xffffffff;
      uStack_100 = 0xffffffff;
      uStack_fc = 0xffffffff;
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = (undefined8 *)0x0;
      uStack_e0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      if (uVar25 < uVar18) {
        pRVar5 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar27 = (uint *)((long)local_f0 + uVar25 * 0x20);
        uVar28 = 0;
        do {
          uVar30 = *puVar27;
          pGVar6 = pRVar5[puVar27[-4]].ptr;
          lVar29 = (ulong)uVar30 *
                   pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar26 = *(long *)&pGVar6->field_0x58;
          lVar7 = *(long *)&pGVar6[1].time_range.upper;
          p_Var8 = pGVar6[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar26 + lVar29) * (long)p_Var8);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          uVar11 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar26 + 4 + lVar29) * (long)p_Var8);
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar26 + 8 + lVar29) * (long)p_Var8);
          uVar15 = *puVar2;
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          *(uint *)((long)&local_108 + uVar28 * 4) = puVar27[-4];
          local_48[uVar28] = uVar30;
          *(undefined4 *)((long)&local_e8 + uVar28 * 4) = uVar9;
          *(undefined4 *)((long)&local_d8 + uVar28 * 4) = uVar10;
          *(undefined4 *)((long)&local_c8 + uVar28 * 4) = uVar11;
          *(undefined4 *)((long)&local_b8 + uVar28 * 4) = uVar12;
          *(undefined4 *)((long)&local_a8 + uVar28 * 4) = uVar13;
          *(undefined4 *)((long)&local_98 + uVar28 * 4) = uVar14;
          *(undefined4 *)((long)&local_78 + uVar28 * 4) = uVar15;
          *(undefined4 *)((long)&local_68 + uVar28 * 4) = uVar16;
          *(undefined4 *)((long)&local_58 + uVar28 * 4) = uVar17;
          uVar19 = uVar28 + 1;
          if (2 < uVar28) break;
          lVar26 = uVar28 + uVar25;
          puVar27 = puVar27 + 8;
          uVar28 = uVar19;
        } while (lVar26 + 1U < uVar18);
        uVar25 = uVar25 + uVar19;
        lVar26 = local_88;
        this = local_80;
        uVar30 = local_48[0];
        uVar31 = local_48[1];
        uVar32 = local_48[2];
        uVar33 = local_48[3];
      }
      else {
        uStack_fc = 0xffffffff;
        local_108._0_4_ = 0xffffffff;
        local_108._4_4_ = 0xffffffff;
        uStack_100 = 0xffffffff;
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        uStack_50._0_4_ = 0;
        uStack_50._4_4_ = 0;
        local_68._0_4_ = 0;
        local_68._4_4_ = 0;
        uStack_60._0_4_ = 0;
        uStack_60._4_4_ = 0;
        local_78._0_4_ = 0;
        local_78._4_4_ = 0;
        uStack_70._0_4_ = 0;
        uStack_70._4_4_ = 0;
        local_98._0_4_ = 0;
        local_98._4_4_ = 0;
        uStack_90._0_4_ = 0;
        uStack_90._4_4_ = 0;
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
        uStack_a0._0_4_ = 0;
        uStack_a0._4_4_ = 0;
        local_b8._0_4_ = 0;
        local_b8._4_4_ = 0;
        uStack_b0._0_4_ = 0;
        uStack_b0._4_4_ = 0;
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0._0_4_ = 0;
        uStack_c0._4_4_ = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        uStack_d0._0_4_ = 0;
        uStack_d0._4_4_ = 0;
        local_e8._0_4_ = 0;
        local_e8._4_4_ = 0;
        uStack_e0._0_4_ = 0;
        uStack_e0._4_4_ = 0;
      }
      pcVar21 = pcVar20 + lVar24 * 0xb0;
      *(undefined4 *)pcVar21 = (undefined4)local_e8;
      *(undefined4 *)(pcVar21 + 4) = local_e8._4_4_;
      *(undefined4 *)(pcVar21 + 8) = (undefined4)uStack_e0;
      *(undefined4 *)(pcVar21 + 0xc) = uStack_e0._4_4_;
      *(undefined4 *)(pcVar21 + 0x10) = (undefined4)local_d8;
      *(undefined4 *)(pcVar21 + 0x14) = local_d8._4_4_;
      *(undefined4 *)(pcVar21 + 0x18) = (undefined4)uStack_d0;
      *(undefined4 *)(pcVar21 + 0x1c) = uStack_d0._4_4_;
      *(undefined4 *)(pcVar21 + 0x20) = (undefined4)local_c8;
      *(undefined4 *)(pcVar21 + 0x24) = local_c8._4_4_;
      *(undefined4 *)(pcVar21 + 0x28) = (undefined4)uStack_c0;
      *(undefined4 *)(pcVar21 + 0x2c) = uStack_c0._4_4_;
      *(undefined4 *)(pcVar21 + 0x30) = (undefined4)local_b8;
      *(undefined4 *)(pcVar21 + 0x34) = local_b8._4_4_;
      *(undefined4 *)(pcVar21 + 0x38) = (undefined4)uStack_b0;
      *(undefined4 *)(pcVar21 + 0x3c) = uStack_b0._4_4_;
      *(undefined4 *)(pcVar21 + 0x40) = (undefined4)local_a8;
      *(undefined4 *)(pcVar21 + 0x44) = local_a8._4_4_;
      *(undefined4 *)(pcVar21 + 0x48) = (undefined4)uStack_a0;
      *(undefined4 *)(pcVar21 + 0x4c) = uStack_a0._4_4_;
      *(undefined4 *)(pcVar21 + 0x50) = (undefined4)local_98;
      *(undefined4 *)(pcVar21 + 0x54) = local_98._4_4_;
      *(undefined4 *)(pcVar21 + 0x58) = (undefined4)uStack_90;
      *(undefined4 *)(pcVar21 + 0x5c) = uStack_90._4_4_;
      *(undefined4 *)(pcVar21 + 0x60) = (undefined4)local_78;
      *(undefined4 *)(pcVar21 + 100) = local_78._4_4_;
      *(undefined4 *)(pcVar21 + 0x68) = (undefined4)uStack_70;
      *(undefined4 *)(pcVar21 + 0x6c) = uStack_70._4_4_;
      *(undefined4 *)(pcVar21 + 0x70) = (undefined4)local_68;
      *(undefined4 *)(pcVar21 + 0x74) = local_68._4_4_;
      *(undefined4 *)(pcVar21 + 0x78) = (undefined4)uStack_60;
      *(undefined4 *)(pcVar21 + 0x7c) = uStack_60._4_4_;
      *(undefined4 *)(pcVar21 + 0x80) = (undefined4)local_58;
      *(undefined4 *)(pcVar21 + 0x84) = local_58._4_4_;
      *(undefined4 *)(pcVar21 + 0x88) = (undefined4)uStack_50;
      *(undefined4 *)(pcVar21 + 0x8c) = uStack_50._4_4_;
      *(undefined4 *)(pcVar21 + 0x90) = (undefined4)local_108;
      *(undefined4 *)(pcVar21 + 0x94) = local_108._4_4_;
      *(undefined4 *)(pcVar21 + 0x98) = uStack_100;
      *(undefined4 *)(pcVar21 + 0x9c) = uStack_fc;
      *(uint *)(pcVar21 + 0xa0) = uVar30;
      *(uint *)(pcVar21 + 0xa4) = uVar31;
      *(uint *)(pcVar21 + 0xa8) = uVar32;
      *(uint *)(pcVar21 + 0xac) = uVar33;
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar26);
  }
  uVar18 = 7;
  if (local_f8 < 7) {
    uVar18 = local_f8;
  }
  return (NodeRef)(uVar18 | (ulong)pcVar20 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }